

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParsePubidLiteral(xmlParserCtxtPtr ctxt)

{
  bool bVar1;
  int max;
  int iVar2;
  xmlParserCtxtPtr pxVar3;
  int newSize;
  xmlChar *tmp;
  xmlChar stop;
  int iStack_28;
  xmlChar cur;
  int maxLength;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  maxLength = 0;
  iStack_28 = 100;
  max = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    max = 10000000;
  }
  if (*ctxt->input->cur == '\"') {
    xmlNextChar(ctxt);
    tmp._2_1_ = 0x22;
  }
  else {
    if (*ctxt->input->cur != '\'') {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlNextChar(ctxt);
    tmp._2_1_ = 0x27;
  }
  _size = (xmlParserCtxtPtr)(*xmlMalloc)(100);
  if (_size == (xmlParserCtxtPtr)0x0) {
    xmlErrMemory(ctxt);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    tmp._3_1_ = *ctxt->input->cur;
    while( true ) {
      bVar1 = false;
      if ((""[tmp._3_1_] != '\0') && (bVar1 = false, tmp._3_1_ != tmp._2_1_)) {
        bVar1 = ctxt->disableSAX < 2;
      }
      if (!bVar1) break;
      if (iStack_28 <= maxLength + 1) {
        iVar2 = xmlGrowCapacity(iStack_28,1,1,max);
        if (iVar2 != 0) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"Public ID");
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
        pxVar3 = (xmlParserCtxtPtr)(*xmlRealloc)(_size,(size_t)iStack_28);
        if (pxVar3 == (xmlParserCtxtPtr)0x0) {
          xmlErrMemory(ctxt);
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
        iStack_28 = 0;
        _size = pxVar3;
      }
      *(byte *)((long)&_size->sax + (long)maxLength) = tmp._3_1_;
      xmlNextChar(ctxt);
      tmp._3_1_ = *ctxt->input->cur;
      maxLength = maxLength + 1;
    }
    *(undefined1 *)((long)&_size->sax + (long)maxLength) = 0;
    if (tmp._3_1_ == tmp._2_1_) {
      if (*ctxt->input->cur == '\n') {
        ctxt->input->line = ctxt->input->line + 1;
        ctxt->input->col = 1;
      }
      else {
        ctxt->input->col = ctxt->input->col + 1;
      }
      ctxt->input->cur = ctxt->input->cur + 1;
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
    }
    ctxt_local = _size;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlParsePubidLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar cur;
    xmlChar stop;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = xmlMalloc(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt);
	return(NULL);
    }
    cur = CUR;
    while ((IS_PUBIDCHAR_CH(cur)) && (cur != stop) &&
           (PARSER_STOPPED(ctxt) == 0)) { /* checked */
	if (len + 1 >= size) {
	    xmlChar *tmp;
            int newSize;

	    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Public ID");
                xmlFree(buf);
                return(NULL);
            }
	    tmp = xmlRealloc(buf, size);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	buf[len++] = cur;
	NEXT;
	cur = CUR;
    }
    buf[len] = 0;
    if (cur != stop) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXTL(1);
    }
    return(buf);
}